

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void sigInt(int signo)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  lVar2 = std::chrono::_V2::steady_clock::now();
  dVar6 = (double)(lVar2 - (long)start.__d.__r) / 1000000000.0;
  iVar1 = std::accumulate<unsigned_int*,int>(p,p + producer_num,0);
  uVar4 = (ulong)iVar1;
  iVar1 = std::accumulate<unsigned_int*,int>(c,c + consumer_num,0);
  uVar5 = producer_num * uVar4 * 0x400;
  lVar2 = sysconf(0x1e);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "----------------------------------------------------------------------------------------------------------------------------"
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"producer thread num:");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,producer_num);
  poVar3 = std::operator<<(poVar3," consumer thread num: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,consumer_num);
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"total_time: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar6);
  poVar3 = std::operator<<(poVar3," seconds\n");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"total_producer_num: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
  poVar3 = std::operator<<(poVar3," objects\n");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"toatl_consumer_num: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(long)iVar1);
  poVar3 = std::operator<<(poVar3," objects\n");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"page_size:");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)lVar2);
  poVar3 = std::operator<<(poVar3," bytes\n");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"object_size:");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x50);
  poVar3 = std::operator<<(poVar3," bytes\n");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"total_size:");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar5);
  poVar3 = std::operator<<(poVar3," bytes\n");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"ops:");
  lVar2 = (long)iVar1 + uVar4;
  auVar7._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar7._0_8_ = lVar2;
  auVar7._12_4_ = 0x45300000;
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,((auVar7._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) / dVar6
                     );
  poVar3 = std::operator<<(poVar3," operations/second\n");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"throught:");
  auVar8._8_4_ = (int)(uVar5 >> 0x20);
  auVar8._0_8_ = uVar5;
  auVar8._12_4_ = 0x45300000;
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(((auVar8._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) /
                             dVar6) * 0.0009765625 * 0.0009765625 * 0.0009765625);
  poVar3 = std::operator<<(poVar3," G/second\n");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "----------------------------------------------------------------------------------------------------------------------------"
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(0);
}

Assistant:

void sigInt(int signo){
    
    auto total_time = std::chrono::duration<double>(std::chrono::steady_clock::now() - start).count(); 
    uint64_t total_producer_objects = std::accumulate(p, p + producer_num, 0);
    uint64_t total_consumer_objects = std::accumulate(c, c + consumer_num, 0);
    uint64_t data_bytes = producer_num * total_producer_objects * sizeof(Object) * DATA_LEN;
   
    uint32_t page_size = sysconf(_SC_PAGESIZE);
    std::cout<<"----------------------------------------------------------------------------------------------------------------------------"<< std::endl; 
    std::cout<<"producer thread num:"<< producer_num <<" consumer thread num: " << consumer_num << std::endl << std::endl;
    std::cout<<"total_time: " << total_time << " seconds\n" << std::endl;
    std::cout<<"total_producer_num: " << total_producer_objects << " objects\n" << std::endl;
    std::cout<<"toatl_consumer_num: " << total_consumer_objects << " objects\n" << std::endl;
    std::cout<<"page_size:" << page_size << " bytes\n" << std::endl;
    std::cout<<"object_size:" << sizeof(Object)  + DATA_LEN << " bytes\n" << std::endl;
    std::cout<<"total_size:" << data_bytes << " bytes\n" << std::endl;
    
    std::cout<<"ops:" << (total_producer_objects + total_consumer_objects) * 1.0 / total_time << " operations/second\n" <<std::endl;
    std::cout<<"throught:" << data_bytes * 1.0 / total_time / 1024 / 1024 / 1024 << " G/second\n" << std::endl; 
    std::cout<<"----------------------------------------------------------------------------------------------------------------------------"<< std::endl; 
    exit(0);
}